

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR N_OP_cdr(LispPTR tos)

{
  ushort uVar1;
  LispPTR *pLVar2;
  DLword cdr_code;
  ConsCell *datum68k;
  LispPTR tos_local;
  
  if (tos == 0) {
    datum68k._4_4_ = 0;
  }
  else if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) == 5) {
    pLVar2 = NativeAligned4FromLAddr(tos);
    uVar1 = (ushort)(*pLVar2 >> 0x1c);
    if (uVar1 == 8) {
      datum68k._4_4_ = 0;
    }
    else if (uVar1 < 9) {
      if (uVar1 == 0) {
        datum68k._4_4_ = cdr(*pLVar2 & 0xfffffff);
      }
      else {
        pLVar2 = NativeAligned4FromLAddr(tos + (uint)uVar1 * 2);
        datum68k._4_4_ = *pLVar2 & 0xfffffff;
      }
    }
    else {
      datum68k._4_4_ = tos + (uVar1 & 7) * 2;
    }
  }
  else {
    MachineState.errorexit = 1;
    datum68k._4_4_ = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return datum68k._4_4_;
}

Assistant:

LispPTR N_OP_cdr(LispPTR tos) {
  ConsCell *datum68k;
  DLword cdr_code;

  if (tos == NIL_PTR) return (tos);
  if (!Listp(tos)) {
      ERROR_EXIT(tos);
  }

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  cdr_code = datum68k->cdr_code;

    if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr-nil */
    if (cdr_code > CDR_ONPAGE) /* cdr-samepage */
#ifdef NEWCDRCODING
      return (tos + ((cdr_code & 7) << 1));
#else
      return (POINTER_PAGEBASE(tos) + ((cdr_code & 127) << 1));
#endif                                 /*NEWCDRCODING */
    if (cdr_code == CDR_INDIRECT) /* cdr-indirect */
      return (cdr((LispPTR)(datum68k->car_field)));
    /* cdr-differentpage */
#ifdef NEWCDRCODING
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(tos + (cdr_code << 1))))->car_field);
#else
    return ((LispPTR)((ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(tos) + (cdr_code << 1))))->car_field);
#endif /*NEWCDRCODING */
}